

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msf_gif.h
# Opt level: O1

int msf_gif_frame(MsfGifState *handle,uint8_t *pixelData,int centiSecondsPerFame,int maxBitDepth,
                 int pitchInBytes)

{
  long lVar1;
  byte *pbVar2;
  uint *puVar3;
  undefined1 auVar4 [16];
  int iVar5;
  uint *puVar6;
  int16_t *__s;
  size_t __n;
  size_t __n_00;
  uint uVar7;
  uint uVar8;
  uint32_t *puVar9;
  uint32_t *puVar10;
  undefined4 uVar11;
  int iVar12;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  byte bVar17;
  byte bVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  undefined8 *__ptr;
  MsfGifBuffer *pMVar27;
  byte bVar28;
  byte bVar29;
  short sVar30;
  long lVar31;
  uint uVar32;
  int iVar33;
  undefined4 *puVar34;
  uint uVar35;
  uint8_t *puVar36;
  ulong uVar37;
  undefined4 *puVar38;
  byte bVar39;
  uint uVar40;
  char *pcVar41;
  char *pcVar42;
  int iVar43;
  int iVar44;
  uint *puVar45;
  uint uVar46;
  int iVar47;
  uint uVar48;
  uint uVar49;
  bool bVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  ulong uVar54;
  uint uVar55;
  uint uVar56;
  ulong uVar57;
  uint uVar58;
  uint uVar59;
  ulong uVar60;
  undefined1 auVar61 [16];
  uint uVar62;
  uint uVar64;
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  Color3 table [256];
  MsfCookedFrame tmp;
  uint8_t used [65537];
  ulong uStack_20420;
  uint8_t *puStack_203a8;
  ulong uStack_20388;
  ulong uStack_20378;
  ulong uStack_20368;
  byte abStack_20348 [768];
  byte abStack_20048 [65552];
  byte abStack_10038 [65544];
  
  if (handle->listHead == (MsfGifBuffer *)0x0) {
    return 0;
  }
  iVar19 = 0x10;
  if (maxBitDepth < 0x10) {
    iVar19 = maxBitDepth;
  }
  iVar43 = 1;
  if (1 < iVar19) {
    iVar43 = iVar19;
  }
  if (pitchInBytes == 0) {
    pitchInBytes = handle->width << 2;
  }
  puStack_203a8 = pixelData;
  if (pitchInBytes < 0) {
    puStack_203a8 = pixelData + -(((long)handle->height + -1) * (long)pitchInBytes);
  }
  uVar48 = handle->width;
  uVar49 = handle->height;
  uVar23 = (handle->previousFrame).count;
  if ((int)uVar23 < 2) {
    uVar23 = 1;
  }
  iVar19 = (int)(0xa0 / (ulong)uVar23) + (handle->previousFrame).depth;
  if (iVar43 < iVar19) {
    iVar19 = iVar43;
  }
  puVar34 = &msf_cook_frame_rdepthsArray;
  puVar38 = &msf_cook_frame_bdepthsArray;
  if (msf_gif_bgra_flag == 0) {
    puVar38 = &msf_cook_frame_rdepthsArray;
    puVar34 = &msf_cook_frame_bdepthsArray;
  }
  puVar6 = (handle->currentFrame).pixels;
  lVar31 = (long)iVar19;
  do {
    uVar23 = puVar38[lVar31];
    uVar24 = (&msf_cook_frame_gdepthsArray)[lVar31];
    uVar32 = puVar34[lVar31];
    iVar19 = uVar23 + uVar32 + uVar24;
    uVar46 = 1 << ((byte)iVar19 & 0x1f);
    memset(abStack_10038,0,(long)(int)(uVar46 + 1));
    bVar28 = (byte)uVar24;
    bVar18 = (byte)uVar23;
    uVar20 = ~(-1 << (bVar28 & 0x1f)) << (bVar18 & 0x1f);
    bVar29 = (byte)uVar32;
    uVar21 = (~(-1 << (bVar29 & 0x1f)) << (bVar18 & 0x1f)) << (bVar28 & 0x1f);
    if (0 < (int)uVar49) {
      sVar51 = (short)(int)(((255.0 - (float)~(-1 << (8 - bVar29 & 0x1f))) / 255.0) * 257.0);
      sVar52 = (short)(int)(((255.0 - (float)~(-1 << (8 - bVar18 & 0x1f))) / 255.0) * 257.0);
      uVar35 = 0x10 - uVar23;
      sVar30 = (short)(int)(((255.0 - (float)~(-1 << (8 - bVar28 & 0x1f))) / 255.0) * 257.0);
      bVar17 = (byte)(uVar35 - uVar24);
      uVar37 = 0;
      puVar36 = puStack_203a8;
      puVar45 = puVar6;
      do {
        iVar43 = msf_gif_alpha_threshold;
        auVar16 = _DAT_00189110;
        auVar15 = _DAT_00189100;
        auVar14 = _DAT_001890f0;
        uVar40 = (int)uVar37 * 4 & 0xc;
        uVar26 = 0;
        if (3 < (int)uVar48) {
          lVar1 = (ulong)uVar40 * 4;
          uVar55 = *(uint *)(msf_cook_frame_ditherKernel + lVar1);
          uVar56 = *(uint *)(msf_cook_frame_ditherKernel + lVar1 + 4);
          uVar7 = *(uint *)(msf_cook_frame_ditherKernel + lVar1 + 8);
          uVar8 = *(uint *)(msf_cook_frame_ditherKernel + lVar1 + 0xc);
          uStack_20368 = (ulong)uVar32;
          uVar62 = uVar55 >> uStack_20368;
          uVar64 = uVar56 >> uStack_20368;
          uStack_20368 = (ulong)uVar32;
          auVar63._0_4_ = uVar62 << 0x10;
          auVar63._4_4_ = uVar64 << 0x10;
          auVar63._8_4_ = (uVar7 >> uStack_20368) << 0x10;
          auVar63._12_4_ = (uVar8 >> uStack_20368) << 0x10;
          uStack_20378 = (ulong)uVar23;
          auVar61._0_4_ = uVar55 >> uStack_20378;
          auVar61._4_4_ = uVar56 >> uStack_20378;
          uStack_20378 = (ulong)uVar23;
          auVar61._8_4_ = uVar7 >> uStack_20378;
          auVar61._12_4_ = uVar8 >> uStack_20378;
          uStack_20388 = (ulong)uVar24;
          uVar55 = uVar55 >> uStack_20388;
          uVar56 = uVar56 >> uStack_20388;
          uStack_20388 = (ulong)uVar24;
          uVar26 = 0;
          do {
            auVar4 = *(undefined1 (*) [16])(puVar36 + uVar26 * 4);
            auVar65 = auVar4 & auVar14;
            auVar66._0_2_ = auVar65._0_2_ * sVar52;
            auVar66._2_2_ = auVar65._2_2_ * sVar51;
            auVar66._4_2_ = auVar65._4_2_ * sVar52;
            auVar66._6_2_ = auVar65._6_2_ * sVar51;
            auVar66._8_2_ = auVar65._8_2_ * sVar52;
            auVar66._10_2_ = auVar65._10_2_ * sVar51;
            auVar66._12_2_ = auVar65._12_2_ * sVar52;
            auVar66._14_2_ = auVar65._14_2_ * sVar51;
            auVar66 = paddusw(auVar66,auVar61 | auVar63);
            auVar67 = auVar66 & auVar15;
            uVar54 = (ulong)uVar35;
            uVar60 = (ulong)(0x20 - iVar19);
            auVar68._0_4_ = auVar4._0_4_ >> 8;
            auVar68._4_4_ = auVar4._4_4_ >> 8;
            auVar68._8_4_ = auVar4._8_4_ >> 8;
            auVar68._12_4_ = auVar4._12_4_ >> 8;
            auVar68 = auVar68 & auVar16;
            auVar69._0_2_ = auVar68._0_2_ * sVar30;
            sVar53 = sVar30 >> 0xf;
            auVar69._2_2_ = auVar68._2_2_ * sVar53;
            auVar69._4_2_ = auVar68._4_2_ * sVar30;
            auVar69._6_2_ = auVar68._6_2_ * sVar53;
            auVar69._8_2_ = auVar68._8_2_ * sVar30;
            auVar69._10_2_ = auVar68._10_2_ * sVar53;
            auVar69._12_2_ = auVar68._12_2_ * sVar30;
            auVar69._14_2_ = auVar68._14_2_ * sVar53;
            auVar65._4_4_ = uVar56;
            auVar65._0_4_ = uVar55;
            auVar65._8_4_ = uVar7 >> uStack_20388;
            auVar65._12_4_ = uVar8 >> uStack_20388;
            auVar65 = paddusw(auVar69,auVar65);
            uVar57 = (ulong)(uVar35 - uVar24);
            uVar62 = -(uint)((int)(auVar4._0_4_ >> 0x18) < iVar43);
            uVar64 = -(uint)((int)(auVar4._4_4_ >> 0x18) < iVar43);
            uVar58 = -(uint)((int)(auVar4._8_4_ >> 0x18) < iVar43);
            uVar59 = -(uint)((int)(auVar4._12_4_ >> 0x18) < iVar43);
            puVar3 = puVar45 + uVar26;
            *puVar3 = ~uVar62 & (auVar65._0_4_ >> uVar57 & uVar20 |
                                auVar66._0_4_ >> uVar60 & uVar21 | auVar67._0_4_ >> uVar54) |
                      uVar46 & uVar62;
            puVar3[1] = ~uVar64 & (auVar65._4_4_ >> uVar57 & uVar20 |
                                  auVar66._4_4_ >> uVar60 & uVar21 | auVar67._4_4_ >> uVar54) |
                        uVar46 & uVar64;
            puVar3[2] = ~uVar58 & (auVar65._8_4_ >> uVar57 & uVar20 |
                                  auVar66._8_4_ >> uVar60 & uVar21 | auVar67._8_4_ >> uVar54) |
                        uVar46 & uVar58;
            puVar3[3] = ~uVar59 & (auVar65._12_4_ >> uVar57 & uVar20 |
                                  auVar66._12_4_ >> uVar60 & uVar21 | auVar67._12_4_ >> uVar54) |
                        uVar46 & uVar59;
            uVar26 = uVar26 + 4;
          } while ((long)uVar26 < (long)(int)uVar48 + -3);
        }
        if ((int)uVar26 < (int)uVar48) {
          uVar26 = uVar26 & 0xffffffff;
          do {
            uVar55 = uVar46;
            if (msf_gif_alpha_threshold <= (int)(uint)puVar36[uVar26 * 4 + 3]) {
              iVar43 = *(int *)(msf_cook_frame_ditherKernel + (ulong)((uint)uVar26 & 3 | uVar40) * 4
                               );
              iVar44 = (iVar43 >> (bVar29 & 0x1f)) + (uint)puVar36[uVar26 * 4 + 2] * (int)sVar51;
              if (0xfffe < iVar44) {
                iVar44 = 0xffff;
              }
              iVar22 = (iVar43 >> (bVar28 & 0x1f)) + (uint)puVar36[uVar26 * 4 + 1] * (int)sVar30;
              if (0xfffe < iVar22) {
                iVar22 = 0xffff;
              }
              iVar43 = (iVar43 >> (bVar18 & 0x1f)) + (uint)puVar36[uVar26 * 4] * (int)sVar52;
              if (0xfffe < iVar43) {
                iVar43 = 0xffff;
              }
              uVar55 = iVar43 >> ((byte)uVar35 & 0x1f) |
                       iVar22 >> (bVar17 & 0x1f) & uVar20 |
                       iVar44 >> (bVar17 - bVar29 & 0x1f) & uVar21;
            }
            puVar45[uVar26] = uVar55;
            uVar26 = uVar26 + 1;
          } while (uVar48 != uVar26);
        }
        uVar37 = uVar37 + 1;
        puVar45 = puVar45 + (int)uVar48;
        puVar36 = puVar36 + pitchInBytes;
      } while (uVar37 != uVar49);
    }
    if (0 < (int)(uVar48 * uVar49)) {
      uVar37 = 0;
      do {
        abStack_10038[puVar6[uVar37]] = 1;
        uVar37 = uVar37 + 1;
      } while (uVar48 * uVar49 != uVar37);
    }
    uVar23 = 0;
    if (iVar19 != 0x1f) {
      if ((int)uVar46 < 2) {
        uVar46 = 1;
      }
      uVar37 = 0;
      uVar23 = 0;
      do {
        uVar23 = uVar23 + abStack_10038[uVar37];
        uVar37 = uVar37 + 1;
      } while (uVar46 != uVar37);
    }
    if (uVar23 < 0x100) {
      iVar19 = (int)lVar31;
      goto LAB_00124f02;
    }
    lVar31 = lVar31 + -1;
  } while (lVar31 != 0);
  iVar19 = 0;
LAB_00124f02:
  iVar43 = puVar38[iVar19];
  iVar44 = (&msf_cook_frame_gdepthsArray)[iVar19];
  iVar22 = puVar34[iVar19];
  (handle->currentFrame).pixels = puVar6;
  (handle->currentFrame).depth = iVar19;
  (handle->currentFrame).count = uVar23;
  (handle->currentFrame).rbits = iVar43;
  (handle->currentFrame).gbits = iVar44;
  (handle->currentFrame).bbits = iVar22;
  iVar19 = handle->width;
  iVar5 = handle->height;
  __s = handle->lzwMem;
  uVar48 = iVar5 * iVar19;
  __ptr = (undefined8 *)malloc((long)((int)(uVar48 * 3) / 2 + 0x330));
  if (__ptr != (undefined8 *)0x0) {
    iVar47 = iVar44 + iVar43 + iVar22;
    uVar49 = 1 << ((byte)iVar47 & 0x1f);
    memset(abStack_20348,0,0x300);
    abStack_20048[(int)uVar49] = 0;
    iVar33 = 1;
    if (iVar47 != 0x1f) {
      bVar18 = (byte)iVar43;
      bVar28 = (byte)iVar44;
      bVar29 = (byte)iVar22;
      iVar33 = 1;
      uVar23 = uVar49;
      if ((int)uVar49 < 2) {
        uVar23 = 1;
      }
      uVar37 = 0;
      do {
        if (abStack_10038[uVar37] != 0) {
          uVar46 = (uint)uVar37;
          uVar32 = uVar46 << (8 - bVar18 & 0x1f);
          uVar24 = (uVar46 >> (bVar18 & 0x1f)) << (8 - bVar28 & 0x1f);
          iVar47 = (uVar46 >> ((byte)(iVar44 + iVar43) & 0x1f)) << (8 - bVar29 & 0x1f);
          uVar20 = uVar32 & 0xff;
          uVar46 = uVar24 & 0xff;
          bVar39 = (byte)(uVar20 >> (bVar18 * '\x03' & 0x1f)) | (byte)uVar32 |
                   (byte)(uVar20 >> (bVar18 * '\x02' & 0x1f)) | (byte)(uVar20 >> (bVar18 & 0x1f));
          bVar17 = (byte)(iVar47 >> (bVar29 * '\x03' & 0x1f)) | (byte)iVar47 |
                   (byte)(iVar47 >> (bVar29 * '\x02' & 0x1f)) | (byte)(iVar47 >> (bVar29 & 0x1f));
          lVar31 = (long)iVar33 * 3;
          abStack_20348[lVar31] = bVar39;
          abStack_20348[lVar31 + 1] =
               (byte)(uVar46 >> (bVar28 * '\x03' & 0x1f)) | (byte)uVar24 |
               (byte)(uVar46 >> (bVar28 * '\x02' & 0x1f)) | (byte)(uVar46 >> (bVar28 & 0x1f));
          abStack_20048[uVar37] = (byte)iVar33;
          abStack_20348[lVar31 + 2] = bVar17;
          if (msf_gif_bgra_flag != 0) {
            abStack_20348[lVar31] = bVar17;
            abStack_20348[lVar31 + 2] = bVar39;
          }
          iVar33 = iVar33 + 1;
        }
        uVar37 = uVar37 + 1;
      } while (uVar23 != uVar37);
    }
    uVar23 = 0x1f;
    if (iVar33 - 1U != 0) {
      for (; iVar33 - 1U >> uVar23 == 0; uVar23 = uVar23 - 1) {
      }
    }
    iVar25 = (uVar23 ^ 0xffffffe0) + 0x21;
    iVar47 = 2;
    if (2 < iVar25) {
      iVar47 = iVar25;
    }
    bVar28 = (byte)iVar47;
    uVar23 = 1 << (bVar28 & 0x1f);
    if (iVar43 == (handle->previousFrame).rbits) {
      bVar50 = iVar22 == (handle->previousFrame).bbits && iVar44 == (handle->previousFrame).gbits;
    }
    else {
      bVar50 = false;
    }
    puVar45 = (handle->previousFrame).pixels;
    bVar50 = (bool)(abStack_10038[(int)uVar49] == 0 & bVar50);
    if ((abStack_10038[(int)uVar49] != 0) && (0 < handle->framesSubmitted)) {
      handle->listTail->field_0x13 = 9;
    }
    *(undefined4 *)(__ptr + 2) = 0x504f921;
    *(short *)((long)__ptr + 0x14) = (short)centiSecondsPerFame;
    *(undefined4 *)((long)__ptr + 0x16) = 0x2c0000;
    *(undefined4 *)((long)__ptr + 0x19) = 0;
    *(short *)((long)__ptr + 0x1d) = (short)iVar19;
    *(short *)((long)__ptr + 0x1f) = (short)iVar5;
    *(byte *)((long)__ptr + 0x21) = bVar28 - 1 | 0x80;
    __n = (long)(int)uVar23 * 3;
    memcpy((void *)((long)__ptr + 0x22),abStack_20348,__n);
    pcVar41 = (char *)((long)__ptr + __n + 0x23);
    *(byte *)((long)__ptr + __n + 0x22) = bVar28;
    uVar32 = 0;
    memset(pcVar41,0,0x104);
    *(undefined1 *)((long)__ptr + __n + 0x23) = 0xff;
    __n_00 = (long)(iVar33 << 0xc) * 2;
    memset(__s,0xff,__n_00);
    uVar24 = uVar23 + 1;
    pbVar2 = (byte *)((long)__ptr + __n + 0x24);
    *pbVar2 = *pbVar2 | (byte)uVar23;
    pbVar2 = (byte *)((long)__ptr + __n + 0x25);
    *pbVar2 = *pbVar2 | (byte)(uVar23 >> 8);
    uVar49 = 0x1f;
    if (uVar24 != 0) {
      for (; uVar24 >> uVar49 == 0; uVar49 = uVar49 - 1) {
      }
    }
    pbVar2 = (byte *)((long)__ptr + __n + 0x26);
    *pbVar2 = *pbVar2 | (byte)(uVar23 >> 0x10);
    if ((!bVar50) || (*puVar6 != *puVar45)) {
      uVar32 = (uint)abStack_20048[*puVar6];
    }
    uVar46 = uVar23 + 2;
    uStack_20420 = (ulong)((uVar49 ^ 0xffffffe0) + 0x29);
    uVar49 = uVar46;
    if (1 < (int)uVar48) {
      uVar37 = 1;
      do {
        if ((!bVar50) || (uVar26 = 0, puVar6[uVar37] != puVar45[uVar37])) {
          uVar26 = (ulong)abStack_20048[puVar6[uVar37]];
        }
        uVar20 = (int)__s[(long)(int)(uVar32 * iVar33) + uVar26];
        if (__s[(long)(int)(uVar32 * iVar33) + uVar26] < 0) {
          bVar18 = (byte)uStack_20420 & 7;
          uVar54 = uStack_20420 >> 3;
          pcVar41[uVar54] = pcVar41[uVar54] | (byte)(uVar32 << bVar18);
          bVar28 = 8 - bVar18 & 0x1f;
          pcVar41[uVar54 + 1] = pcVar41[uVar54 + 1] | (byte)(uVar32 >> bVar28);
          pcVar41[uVar54 + 2] = pcVar41[uVar54 + 2] | (byte)(uVar32 >> (0x10 - bVar18 & 0x1f));
          uVar21 = 0x1f;
          if (uVar49 - 1 != 0) {
            for (; uVar49 - 1 >> uVar21 == 0; uVar21 = uVar21 - 1) {
            }
          }
          iVar19 = (int)uStack_20420 + (uVar21 ^ 0xffffffe0);
          uVar35 = iVar19 + 0x21;
          if (0x7ff < uVar35) {
            uVar35 = iVar19 - 0x7d7;
            *(undefined2 *)(pcVar41 + 0x101) = *(undefined2 *)(pcVar41 + 0x100);
            pcVar41[0x100] = -1;
            memset(pcVar41 + 0x104,0 >> bVar28,0x100);
            pcVar41 = pcVar41 + 0x100;
          }
          uStack_20420 = (ulong)uVar35;
          uVar20 = (uint)uVar26;
          if ((int)uVar49 < 0x1000) {
            __s[(long)(int)(uVar32 * iVar33) + uVar26] = (int16_t)uVar49;
            uVar49 = uVar49 + 1;
          }
          else {
            bVar18 = (byte)uVar35 & 7;
            uVar26 = (ulong)(uVar35 >> 3);
            pcVar41[uVar26] = pcVar41[uVar26] | (byte)(uVar23 << bVar18);
            bVar28 = 8 - bVar18 & 0x1f;
            pcVar41[uVar26 + 1] = pcVar41[uVar26 + 1] | (byte)(uVar23 >> bVar28);
            pcVar41[uVar26 + 2] = pcVar41[uVar26 + 2] | (byte)(uVar23 >> (0x10 - bVar18 & 0x1f));
            uVar35 = (uVar21 ^ 0xffffffe0) + 0x21 + uVar35;
            if (0x7ff < uVar35) {
              uVar35 = uVar35 - 0x7f8;
              *(undefined2 *)(pcVar41 + 0x101) = *(undefined2 *)(pcVar41 + 0x100);
              pcVar41[0x100] = -1;
              memset(pcVar41 + 0x104,0 >> bVar28,0x100);
              pcVar41 = pcVar41 + 0x100;
            }
            memset(__s,0xff,__n_00);
            uStack_20420 = (ulong)uVar35;
            uVar49 = uVar46;
          }
        }
        uVar32 = uVar20;
        uVar37 = uVar37 + 1;
      } while (uVar48 != uVar37);
    }
    uVar48 = 0x1f;
    if (uVar49 - 1 != 0) {
      for (; uVar49 - 1 >> uVar48 == 0; uVar48 = uVar48 - 1) {
      }
    }
    iVar19 = (uVar48 ^ 0xffffffe0) + 0x21;
    if (0xb < iVar19) {
      iVar19 = 0xc;
    }
    bVar18 = (byte)uStack_20420 & 7;
    uVar37 = uStack_20420 >> 3;
    pcVar41[uVar37] = pcVar41[uVar37] | (byte)(uVar32 << bVar18);
    bVar28 = 8 - bVar18 & 0x1f;
    pcVar41[uVar37 + 1] = pcVar41[uVar37 + 1] | (byte)(uVar32 >> bVar28);
    pcVar41[uVar37 + 2] = pcVar41[uVar37 + 2] | (byte)(uVar32 >> (0x10 - bVar18 & 0x1f));
    uVar48 = iVar19 + (int)uStack_20420;
    pcVar42 = pcVar41;
    if (0x7ff < uVar48) {
      uVar48 = uVar48 - 0x7f8;
      pcVar42 = pcVar41 + 0x100;
      *(undefined2 *)(pcVar41 + 0x101) = *(undefined2 *)(pcVar41 + 0x100);
      pcVar41[0x100] = -1;
      memset(pcVar41 + 0x104,0 >> bVar28,0x100);
    }
    uVar23 = 0x1f;
    if (uVar49 != 0) {
      for (; uVar49 >> uVar23 == 0; uVar23 = uVar23 - 1) {
      }
    }
    iVar43 = (uVar23 ^ 0xffffffe0) + 0x21;
    iVar19 = 0xc;
    if (iVar43 < 0xc) {
      iVar19 = iVar43;
    }
    bVar18 = (byte)uVar48 & 7;
    uVar37 = (ulong)(uVar48 >> 3);
    pcVar42[uVar37] = pcVar42[uVar37] | (byte)(uVar24 << bVar18);
    bVar28 = 8 - bVar18 & 0x1f;
    pcVar42[uVar37 + 1] = pcVar42[uVar37 + 1] | (byte)(uVar24 >> bVar28);
    pcVar42[uVar37 + 2] = pcVar42[uVar37 + 2] | (byte)(uVar24 >> (0x10 - bVar18 & 0x1f));
    uVar48 = iVar19 + uVar48;
    pcVar41 = pcVar42;
    if (0x7ff < uVar48) {
      uVar48 = uVar48 - 0x7f8;
      pcVar41 = pcVar42 + 0x100;
      *(undefined2 *)(pcVar42 + 0x101) = *(undefined2 *)(pcVar42 + 0x100);
      pcVar42[0x100] = -1;
      memset(pcVar42 + 0x104,0 >> bVar28,0x100);
    }
    if (8 < uVar48) {
      uVar48 = uVar48 + 7 >> 3;
      *pcVar41 = (char)uVar48 + -1;
      pcVar41 = pcVar41 + uVar48;
    }
    *pcVar41 = '\0';
    *__ptr = 0;
    __ptr[1] = pcVar41 + (1 - (long)(__ptr + 2));
    pMVar27 = (MsfGifBuffer *)realloc(__ptr,(size_t)(pcVar41 + (0x11 - (long)(__ptr + 2))));
    if (pMVar27 != (MsfGifBuffer *)0x0) goto LAB_00125695;
    free(__ptr);
  }
  pMVar27 = (MsfGifBuffer *)0x0;
LAB_00125695:
  if (pMVar27 == (MsfGifBuffer *)0x0) {
    msf_free_gif_state(handle);
    return 0;
  }
  handle->listTail->next = pMVar27;
  handle->listTail = pMVar27;
  puVar9 = (handle->previousFrame).pixels;
  iVar5 = (handle->previousFrame).depth;
  iVar33 = (handle->previousFrame).count;
  iVar47 = (handle->previousFrame).rbits;
  iVar25 = (handle->previousFrame).gbits;
  iVar12 = (handle->previousFrame).bbits;
  uVar13 = *(undefined4 *)&(handle->previousFrame).field_0x1c;
  puVar10 = (handle->currentFrame).pixels;
  iVar44 = (handle->currentFrame).depth;
  iVar22 = (handle->currentFrame).count;
  iVar19 = (handle->currentFrame).gbits;
  iVar43 = (handle->currentFrame).bbits;
  uVar11 = *(undefined4 *)&(handle->currentFrame).field_0x1c;
  (handle->previousFrame).rbits = (handle->currentFrame).rbits;
  (handle->previousFrame).gbits = iVar19;
  (handle->previousFrame).bbits = iVar43;
  *(undefined4 *)&(handle->previousFrame).field_0x1c = uVar11;
  (handle->previousFrame).pixels = puVar10;
  (handle->previousFrame).depth = iVar44;
  (handle->previousFrame).count = iVar22;
  (handle->currentFrame).pixels = puVar9;
  (handle->currentFrame).depth = iVar5;
  (handle->currentFrame).count = iVar33;
  (handle->currentFrame).rbits = iVar47;
  (handle->currentFrame).gbits = iVar25;
  (handle->currentFrame).bbits = iVar12;
  *(undefined4 *)&(handle->currentFrame).field_0x1c = uVar13;
  handle->framesSubmitted = handle->framesSubmitted + 1;
  return 1;
}

Assistant:

int msf_gif_frame(MsfGifState * handle, uint8_t * pixelData, int centiSecondsPerFame, int maxBitDepth, int pitchInBytes)
{ MsfTimeFunc
    if (!handle->listHead) { return 0; }

    maxBitDepth = msf_imax(1, msf_imin(16, maxBitDepth));
    if (pitchInBytes == 0) pitchInBytes = handle->width * 4;
    if (pitchInBytes < 0) pixelData -= pitchInBytes * (handle->height - 1);

    uint8_t used[(1 << 16) + 1]; //only 64k, so stack allocating is fine
    msf_cook_frame(&handle->currentFrame, pixelData, used, handle->width, handle->height, pitchInBytes,
        msf_imin(maxBitDepth, handle->previousFrame.depth + 160 / msf_imax(1, handle->previousFrame.count)));

    MsfGifBuffer * buffer = msf_compress_frame(handle->customAllocatorContext, handle->width, handle->height,
        centiSecondsPerFame, handle->currentFrame, handle, used, handle->lzwMem);
    if (!buffer) { msf_free_gif_state(handle); return 0; }
    handle->listTail->next = buffer;
    handle->listTail = buffer;

    //swap current and previous frames
    MsfCookedFrame tmp = handle->previousFrame;
    handle->previousFrame = handle->currentFrame;
    handle->currentFrame = tmp;

    handle->framesSubmitted += 1;
    return 1;
}